

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolygonTessellation.h
# Opt level: O2

void anurbs::PolygonTessellation::register_python(module *m)

{
  class_<anurbs::PolygonTessellation> *pcVar1;
  string name;
  class_<anurbs::PolygonTessellation> cStack_88;
  char *local_80 [4];
  arg local_60;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  arg local_30;
  code *local_20;
  undefined8 local_18;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::PolygonTessellation>::class_<>
            (&cStack_88,(m->super_object).super_handle.m_ptr,local_80[0]);
  pybind11::detail::initimpl::constructor<>::
  execute<pybind11::class_<anurbs::PolygonTessellation>,_0>(&cStack_88);
  local_20 = compute;
  local_18 = 0;
  local_30.name = "polygon";
  local_30._8_1_ = 2;
  pcVar1 = pybind11::class_<anurbs::PolygonTessellation>::
           def<void(anurbs::PolygonTessellation::*)(anurbs::Polygon_const&),pybind11::arg>
                     (&cStack_88,"compute",(offset_in_Model_to_subr *)&local_20,&local_30);
  local_40 = nb_triangles;
  local_38 = 0;
  pcVar1 = pybind11::class_<anurbs::PolygonTessellation>::
           def<long(anurbs::PolygonTessellation::*)()const>
                     (pcVar1,"nb_triangles",(offset_in_Model_to_subr *)&local_40);
  local_50 = triangle;
  local_48 = 0;
  local_60.name = "index";
  local_60._8_1_ = 2;
  pybind11::class_<anurbs::PolygonTessellation>::
  def<std::tuple<long,long,long>(anurbs::PolygonTessellation::*)(long)const,pybind11::arg>
            (pcVar1,"triangle",(offset_in_Model_to_subr *)&local_50,&local_60);
  pybind11::object::~object((object *)&cStack_88);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = PolygonTessellation;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            .def(py::init<>())
            .def("compute", &Type::compute, "polygon"_a)
            .def("nb_triangles", &Type::nb_triangles)
            .def("triangle", &Type::triangle, "index"_a)
        ;
    }